

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge.hpp
# Opt level: O2

void __thiscall
optimization::mergeBlocks::Merge_Block::optimize_func(Merge_Block *this,MirFunction *func)

{
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr *__x;
  int *piVar2;
  undefined1 uVar3;
  _Base_ptr p_Var4;
  _Self __tmp_1;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  _Base_ptr p_Var8;
  size_type sVar9;
  mapped_type *pmVar10;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr __args;
  _Self __tmp;
  uint32_t local_9c;
  undefined1 local_68 [32];
  bool local_48;
  _Base_ptr local_40;
  JumpKind local_38;
  
  this_00 = &func->basic_blks;
  p_Var1 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
LAB_001230a5:
  p_Var8 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      return;
    }
    if ((*(int *)&p_Var8[1]._M_left < 0x186a1) && (*(long *)(p_Var8 + 3) == 1)) {
      pmVar5 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at(this_00,(key_type *)(p_Var8[2]._M_left + 1));
      if (*(int *)&p_Var8[4]._M_parent == 1) {
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var1->_M_header);
        lVar7 = std::_Rb_tree_decrement(p_Var6);
        if (pmVar5->id != *(int *)(lVar7 + 0x20)) goto LAB_00123111;
      }
      if (((pmVar5->jump).kind == Br) &&
         (__x = &p_Var8[1]._M_left, (pmVar5->jump).bb_true == *(int *)__x)) break;
    }
LAB_00123111:
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
  piVar2 = &(pmVar5->jump).bb_true;
  p_Var4 = p_Var8[3]._M_left;
  for (__args = p_Var8[3]._M_parent; __args != p_Var4; __args = (_Base_ptr)&__args->_M_parent) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&pmVar5->inst,
               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)__args);
  }
  local_68._8_4_ = *(undefined4 *)&p_Var8[4]._M_parent;
  local_40 = p_Var8[5]._M_parent;
  uVar3 = (undefined1)p_Var8[5]._M_color;
  if (uVar3 == _S_black) {
    local_9c = *(uint32_t *)&p_Var8[4]._M_right;
  }
  local_38 = *(JumpKind *)&p_Var8[5]._M_left;
  local_68._0_8_ = &PTR_display_001db418;
  local_48 = uVar3 != _S_red;
  if (local_48) {
    local_68._16_8_ = &PTR_display_001d90d0;
    local_68._24_4_ = local_9c;
  }
  mir::inst::JumpInstruction::operator=(&pmVar5->jump,(JumpInstruction *)local_68);
  sVar9 = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::count(this_00,piVar2);
  if (sVar9 != 0) {
    pmVar10 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(this_00,piVar2);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(pmVar10->preceding)._M_t,(key_type *)__x);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &pmVar10->preceding,&pmVar5->id);
  }
  piVar2 = &(pmVar5->jump).bb_false;
  sVar9 = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::count(this_00,piVar2);
  if (sVar9 != 0) {
    pmVar10 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(this_00,piVar2);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(pmVar10->preceding)._M_t,(key_type *)__x);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &pmVar10->preceding,&pmVar5->id);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::erase(&this_00->_M_t,(key_type *)__x);
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    return;
  }
  goto LAB_001230a5;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    while (true) {
      bool flag = false;
      for (auto& blkiter : func.basic_blks) {
        auto& blk = blkiter.second;
        if (blk.id > 100000) {
          continue;
        }
        if (blk.preceding.size() == 1) {
          auto& preBlk = func.basic_blks.at(*blk.preceding.begin());
          auto end_iter = func.basic_blks.end();
          end_iter--;
          end_iter--;
          if (blk.jump.kind == mir::inst::JumpInstructionKind::Return &&
              preBlk.id !=
                  end_iter->first) {  // in this case, merge will cause the
                                      // end block's id is not the largest
            continue;
          }

          if (preBlk.jump.kind == mir::inst::JumpInstructionKind::Br &&
              preBlk.jump.bb_true == blk.id) {
            for (auto& inst : blk.inst) {
              preBlk.inst.push_back(std::move(inst));
            }
            preBlk.jump = mir::inst::JumpInstruction(
                blk.jump.kind, blk.jump.bb_true, blk.jump.bb_false,
                blk.jump.cond_or_ret, blk.jump.jump_kind);
            if (func.basic_blks.count(preBlk.jump.bb_true)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_true);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            if (func.basic_blks.count(preBlk.jump.bb_false)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_false);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            flag = true;
            func.basic_blks.erase(blk.id);
            break;
          }
        }
      }
      if (!flag) {
        break;
      }
    }
  }